

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformation::GetModelName_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(this->Implementation->ChipID).ModelName);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetModelName()
{
  return this->Implementation->GetModelName();
}